

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  char *in_RCX;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> local_38;
  
  if (*(long *)(this + 0x10) != 0) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>>
              (&local_38,*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8),
               (char *)(*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8) +
                       *(long *)(this + 0x10)),in_RCX,*it);
    *(ulong *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).limit_ + 4) =
         CONCAT44((undefined4)local_38.super_truncating_iterator_base<wchar_t_*>.count_,
                  local_38.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
    *(undefined8 *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).count_ + 4) =
         local_38._20_8_;
    (it->super_truncating_iterator_base<wchar_t_*>).out_ =
         local_38.super_truncating_iterator_base<wchar_t_*>.out_;
    (it->super_truncating_iterator_base<wchar_t_*>).limit_ =
         CONCAT44(local_38.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                  (undefined4)local_38.super_truncating_iterator_base<wchar_t_*>.limit_);
  }
  std::
  __fill_n_a1<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long,wchar_t>
            (&local_38,*it,*(unsigned_long *)(this + 0x20),(wchar_t *)(this + 0x18));
  *(ulong *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).limit_ + 4) =
       CONCAT44((undefined4)local_38.super_truncating_iterator_base<wchar_t_*>.count_,
                local_38.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).count_ + 4) =
       local_38._20_8_;
  (it->super_truncating_iterator_base<wchar_t_*>).out_ =
       local_38.super_truncating_iterator_base<wchar_t_*>.out_;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ =
       CONCAT44(local_38.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_38.super_truncating_iterator_base<wchar_t_*>.limit_);
  int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
            ((hex_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }